

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.cc
# Opt level: O0

void evp_pkey_set_method(EVP_PKEY *pkey,EVP_PKEY_ASN1_METHOD *method)

{
  EVP_PKEY_ASN1_METHOD *method_local;
  EVP_PKEY *pkey_local;
  
  free_it(pkey);
  pkey->ameth = method;
  pkey->type = pkey->ameth->pkey_id;
  return;
}

Assistant:

void evp_pkey_set_method(EVP_PKEY *pkey, const EVP_PKEY_ASN1_METHOD *method) {
  free_it(pkey);
  pkey->ameth = method;
  pkey->type = pkey->ameth->pkey_id;
}